

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>::copyAppend
          (QGenericArrayOps<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *this,
          pair<BuildsMetaMakefileGenerator::Build_*,_ProString> *b,
          pair<BuildsMetaMakefileGenerator::Build_*,_ProString> *e)

{
  pair<BuildsMetaMakefileGenerator::Build_*,_ProString> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  pair<BuildsMetaMakefileGenerator::Build_*,_ProString> *in_RDI;
  pair<BuildsMetaMakefileGenerator::Build_*,_ProString> *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>::begin
                        ((QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>
                          *)0x1dc5c7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>::pair(this_00,in_RDI);
      local_10 = local_10 + 0x38;
      (in_RDI->second).m_string.d.ptr = (char16_t *)((long)(in_RDI->second).m_string.d.ptr + 1);
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }